

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O2

void __thiscall QDialogPrivate::hideDefault(QDialogPrivate *this)

{
  int i;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QPushButton_*> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.ptr = (QPushButton **)&DAT_aaaaaaaaaaaaaaaa;
  QObject::findChildren<QPushButton*>
            ((QList<QPushButton_*> *)&local_28,*(QObject **)&(this->super_QWidgetPrivate).field_0x8,
             (FindChildOptions)0x1);
  for (puVar1 = (undefined1 *)0x0; puVar1 < (ulong)local_28.size; puVar1 = puVar1 + 1) {
    QPushButton::setDefault(local_28.ptr[(long)puVar1],false);
  }
  QArrayDataPointer<QPushButton_*>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogPrivate::hideDefault()
{
    Q_Q(QDialog);
    QList<QPushButton*> list = q->findChildren<QPushButton*>();
    for (int i=0; i<list.size(); ++i) {
        list.at(i)->setDefault(false);
    }
}